

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_handle.cpp
# Opt level: O2

void __thiscall
libtorrent::session_handle::dht_sample_infohashes
          (session_handle *this,endpoint *ep,sha1_hash *target)

{
  async_call<void(libtorrent::aux::session_impl::*)(boost::asio::ip::basic_endpoint<boost::asio::ip::udp>const&,libtorrent::digest32<160l>const&),boost::asio::ip::basic_endpoint<boost::asio::ip::udp>const&,libtorrent::digest32<160l>const&>
            (this,0x296efa,(basic_endpoint<boost::asio::ip::udp> *)0x0,(digest32<160L> *)ep);
  return;
}

Assistant:

void session_handle::dht_sample_infohashes(udp::endpoint const& ep, sha1_hash const& target)
	{
#ifndef TORRENT_DISABLE_DHT
		async_call(&session_impl::dht_sample_infohashes, ep, target);
#else
		TORRENT_UNUSED(ep);
		TORRENT_UNUSED(target);
#endif
	}